

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::SolveDirect
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B,
          DecomposeType dt)

{
  int iVar1;
  
  if (dt == ELDLt) {
    iVar1 = Solve_LDLt(this,B);
    return iVar1;
  }
  if (dt != ECholesky) {
    if (dt == ELU) {
      iVar1 = Solve_LU(this,B);
      return iVar1;
    }
    Error("Solve  < Unknown decomposition type >",(char *)0x0);
    return 0;
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x42])();
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B)  );
		case ECholesky:
			return( Solve_Cholesky( &B )  );
		case ELDLt:
			return( Solve_LDLt( &B )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}